

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

bool embree::avx2::
     BVHNIntersectorKHybrid<4,_8,_1,_false,_embree::avx2::ArrayIntersectorK_1<8,_embree::avx2::TriangleMIntersectorKMoeller<4,_8,_false>_>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<8> *ray
                ,TravRayK<8,_false> *tray,RayQueryContext *context)

{
  undefined1 (*pauVar1) [16];
  undefined1 (*pauVar2) [16];
  float fVar3;
  float fVar4;
  float fVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  float fVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  ulong uVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  ulong uVar19;
  byte bVar20;
  int iVar21;
  long lVar22;
  ulong uVar23;
  long lVar24;
  ulong uVar25;
  ulong *puVar26;
  ulong uVar27;
  ulong uVar28;
  uint uVar29;
  ulong uVar30;
  bool bVar31;
  bool bVar32;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  vint4 bi;
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  vint4 ai;
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  uint uVar53;
  uint uVar54;
  undefined1 auVar51 [16];
  uint uVar55;
  undefined1 auVar52 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  NodeRef stack [244];
  undefined8 local_8d8;
  float fStack_8d0;
  float fStack_8cc;
  size_t local_7d8;
  ulong local_7d0 [244];
  
  puVar26 = local_7d0;
  local_7d8 = root.ptr;
  fVar3 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  auVar33._4_4_ = fVar3;
  auVar33._0_4_ = fVar3;
  auVar33._8_4_ = fVar3;
  auVar33._12_4_ = fVar3;
  fVar4 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  auVar34._4_4_ = fVar4;
  auVar34._0_4_ = fVar4;
  auVar34._8_4_ = fVar4;
  auVar34._12_4_ = fVar4;
  fVar5 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x40);
  auVar35._4_4_ = fVar5;
  auVar35._0_4_ = fVar5;
  auVar35._8_4_ = fVar5;
  auVar35._12_4_ = fVar5;
  fVar3 = fVar3 * *(float *)((long)&(tray->org).field_0 + k * 4);
  fVar4 = fVar4 * *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  fVar5 = fVar5 * *(float *)((long)&(tray->org).field_0 + k * 4 + 0x40);
  uVar19 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar25 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar27 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x40);
  auVar41._0_8_ = CONCAT44(fVar3,fVar3) ^ 0x8000000080000000;
  auVar41._8_4_ = -fVar3;
  auVar41._12_4_ = -fVar3;
  auVar42._0_8_ = CONCAT44(fVar4,fVar4) ^ 0x8000000080000000;
  auVar42._8_4_ = -fVar4;
  auVar42._12_4_ = -fVar4;
  iVar21 = (tray->tnear).field_0.i[k];
  auVar43._4_4_ = iVar21;
  auVar43._0_4_ = iVar21;
  auVar43._8_4_ = iVar21;
  auVar43._12_4_ = iVar21;
  auVar44._0_8_ = CONCAT44(fVar5,fVar5) ^ 0x8000000080000000;
  auVar44._8_4_ = -fVar5;
  auVar44._12_4_ = -fVar5;
  iVar21 = (tray->tfar).field_0.i[k];
  auVar45._4_4_ = iVar21;
  auVar45._0_4_ = iVar21;
  auVar45._8_4_ = iVar21;
  auVar45._12_4_ = iVar21;
  bVar32 = true;
  auVar36._8_4_ = 0x7fffffff;
  auVar36._0_8_ = 0x7fffffff7fffffff;
  auVar36._12_4_ = 0x7fffffff;
  do {
    uVar28 = puVar26[-1];
    puVar26 = puVar26 + -1;
    while ((uVar28 & 8) == 0) {
      auVar13 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar28 + 0x20 + uVar19),auVar41,auVar33);
      auVar14 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar28 + 0x20 + uVar25),auVar42,auVar34);
      auVar13 = vpmaxsd_avx(auVar13,auVar14);
      auVar14 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar28 + 0x20 + uVar27),auVar44,auVar35);
      auVar14 = vpmaxsd_avx(auVar14,auVar43);
      auVar13 = vpmaxsd_avx(auVar13,auVar14);
      auVar14 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar28 + 0x20 + (uVar19 ^ 0x10)),auVar41,
                                auVar33);
      auVar51 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar28 + 0x20 + (uVar25 ^ 0x10)),auVar42,
                                auVar34);
      auVar14 = vpminsd_avx(auVar14,auVar51);
      auVar51 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar28 + 0x20 + (uVar27 ^ 0x10)),auVar44,
                                auVar35);
      auVar51 = vpminsd_avx(auVar51,auVar45);
      auVar14 = vpminsd_avx(auVar14,auVar51);
      auVar13 = vpcmpgtd_avx(auVar13,auVar14);
      iVar21 = vmovmskps_avx(auVar13);
      if (iVar21 == 0xf) goto LAB_0055aa0f;
      bVar20 = (byte)iVar21 ^ 0xf;
      uVar23 = uVar28 & 0xfffffffffffffff0;
      lVar22 = 0;
      for (uVar28 = (ulong)bVar20; (uVar28 & 1) == 0; uVar28 = uVar28 >> 1 | 0x8000000000000000) {
        lVar22 = lVar22 + 1;
      }
      uVar28 = *(ulong *)(uVar23 + lVar22 * 8);
      uVar29 = bVar20 - 1 & (uint)bVar20;
      uVar30 = (ulong)uVar29;
      if (uVar29 != 0) {
        *puVar26 = uVar28;
        lVar22 = 0;
        for (; (uVar30 & 1) == 0; uVar30 = uVar30 >> 1 | 0x8000000000000000) {
          lVar22 = lVar22 + 1;
        }
        uVar29 = uVar29 - 1 & uVar29;
        uVar30 = (ulong)uVar29;
        bVar31 = uVar29 == 0;
        while( true ) {
          puVar26 = puVar26 + 1;
          uVar28 = *(ulong *)(uVar23 + lVar22 * 8);
          if (bVar31) break;
          *puVar26 = uVar28;
          lVar22 = 0;
          for (uVar28 = uVar30; (uVar28 & 1) == 0; uVar28 = uVar28 >> 1 | 0x8000000000000000) {
            lVar22 = lVar22 + 1;
          }
          uVar30 = uVar30 - 1 & uVar30;
          bVar31 = uVar30 == 0;
        }
      }
    }
    uVar23 = (ulong)((uint)uVar28 & 0xf);
    if (uVar23 != 8) {
      uVar28 = uVar28 & 0xfffffffffffffff0;
      uVar6 = *(undefined4 *)(ray + k * 4);
      uVar7 = *(undefined4 *)(ray + k * 4 + 0x20);
      uVar8 = *(undefined4 *)(ray + k * 4 + 0x40);
      fVar3 = *(float *)(ray + k * 4 + 0x80);
      fVar4 = *(float *)(ray + k * 4 + 0xa0);
      fVar5 = *(float *)(ray + k * 4 + 0xc0);
      lVar22 = 0;
      do {
        lVar24 = lVar22 * 0xb0;
        auVar13 = *(undefined1 (*) [16])(uVar28 + 0x80 + lVar24);
        pauVar1 = (undefined1 (*) [16])(uVar28 + 0x40 + lVar24);
        auVar14 = *(undefined1 (*) [16])(uVar28 + 0x70 + lVar24);
        auVar51 = *(undefined1 (*) [16])(uVar28 + 0x50 + lVar24);
        auVar37._0_4_ = auVar13._0_4_ * *(float *)*pauVar1;
        auVar37._4_4_ = auVar13._4_4_ * *(float *)(*pauVar1 + 4);
        auVar37._8_4_ = auVar13._8_4_ * *(float *)(*pauVar1 + 8);
        auVar37._12_4_ = auVar13._12_4_ * *(float *)(*pauVar1 + 0xc);
        auVar40 = vfmsub231ps_fma(auVar37,auVar14,auVar51);
        pauVar2 = (undefined1 (*) [16])(uVar28 + 0x60 + lVar24);
        auVar10._4_4_ = uVar6;
        auVar10._0_4_ = uVar6;
        auVar10._8_4_ = uVar6;
        auVar10._12_4_ = uVar6;
        auVar10 = vsubps_avx(*(undefined1 (*) [16])(uVar28 + lVar24),auVar10);
        auVar11._4_4_ = uVar7;
        auVar11._0_4_ = uVar7;
        auVar11._8_4_ = uVar7;
        auVar11._12_4_ = uVar7;
        auVar11 = vsubps_avx(*(undefined1 (*) [16])(uVar28 + 0x10 + lVar24),auVar11);
        auVar59._4_4_ = uVar8;
        auVar59._0_4_ = uVar8;
        auVar59._8_4_ = uVar8;
        auVar59._12_4_ = uVar8;
        auVar37 = vsubps_avx(*(undefined1 (*) [16])(uVar28 + 0x20 + lVar24),auVar59);
        auVar59 = *(undefined1 (*) [16])(uVar28 + 0x30 + lVar24);
        auVar60._0_4_ = auVar51._0_4_ * *(float *)*pauVar2;
        auVar60._4_4_ = auVar51._4_4_ * *(float *)(*pauVar2 + 4);
        auVar60._8_4_ = auVar51._8_4_ * *(float *)(*pauVar2 + 8);
        auVar60._12_4_ = auVar51._12_4_ * *(float *)(*pauVar2 + 0xc);
        auVar60 = vfmsub231ps_fma(auVar60,auVar13,auVar59);
        auVar16._4_4_ = fVar3;
        auVar16._0_4_ = fVar3;
        auVar16._8_4_ = fVar3;
        auVar16._12_4_ = fVar3;
        auVar46._0_4_ = auVar11._0_4_ * fVar3;
        auVar46._4_4_ = auVar11._4_4_ * fVar3;
        auVar46._8_4_ = auVar11._8_4_ * fVar3;
        auVar46._12_4_ = auVar11._12_4_ * fVar3;
        auVar18._4_4_ = fVar4;
        auVar18._0_4_ = fVar4;
        auVar18._8_4_ = fVar4;
        auVar18._12_4_ = fVar4;
        auVar15 = vfmsub231ps_fma(auVar46,auVar10,auVar18);
        auVar57._0_4_ = auVar13._0_4_ * auVar15._0_4_;
        auVar57._4_4_ = auVar13._4_4_ * auVar15._4_4_;
        auVar57._8_4_ = auVar13._8_4_ * auVar15._8_4_;
        auVar57._12_4_ = auVar13._12_4_ * auVar15._12_4_;
        auVar47._0_4_ = auVar51._0_4_ * auVar15._0_4_;
        auVar47._4_4_ = auVar51._4_4_ * auVar15._4_4_;
        auVar47._8_4_ = auVar51._8_4_ * auVar15._8_4_;
        auVar47._12_4_ = auVar51._12_4_ * auVar15._12_4_;
        auVar17._4_4_ = fVar5;
        auVar17._0_4_ = fVar5;
        auVar17._8_4_ = fVar5;
        auVar17._12_4_ = fVar5;
        auVar51._0_4_ = fVar5 * auVar10._0_4_;
        auVar51._4_4_ = fVar5 * auVar10._4_4_;
        auVar51._8_4_ = fVar5 * auVar10._8_4_;
        auVar51._12_4_ = fVar5 * auVar10._12_4_;
        auVar51 = vfmsub231ps_fma(auVar51,auVar37,auVar16);
        auVar13 = vfmadd231ps_fma(auVar57,auVar51,auVar14);
        local_8d8._0_4_ = auVar59._0_4_;
        local_8d8._4_4_ = auVar59._4_4_;
        fStack_8d0 = auVar59._8_4_;
        fStack_8cc = auVar59._12_4_;
        auVar38._0_4_ = auVar14._0_4_ * (float)local_8d8;
        auVar38._4_4_ = auVar14._4_4_ * local_8d8._4_4_;
        auVar38._8_4_ = auVar14._8_4_ * fStack_8d0;
        auVar38._12_4_ = auVar14._12_4_ * fStack_8cc;
        auVar16 = vfmsub231ps_fma(auVar38,*pauVar1,*pauVar2);
        auVar14 = vfmadd231ps_fma(auVar47,*pauVar1,auVar51);
        auVar58._0_4_ = fVar4 * auVar37._0_4_;
        auVar58._4_4_ = fVar4 * auVar37._4_4_;
        auVar58._8_4_ = fVar4 * auVar37._8_4_;
        auVar58._12_4_ = fVar4 * auVar37._12_4_;
        auVar17 = vfmsub231ps_fma(auVar58,auVar17,auVar11);
        auVar56._0_4_ = fVar5 * auVar16._0_4_;
        auVar56._4_4_ = fVar5 * auVar16._4_4_;
        auVar56._8_4_ = fVar5 * auVar16._8_4_;
        auVar56._12_4_ = fVar5 * auVar16._12_4_;
        auVar51 = vfmadd231ps_fma(auVar56,auVar18,auVar60);
        auVar15._4_4_ = fVar3;
        auVar15._0_4_ = fVar3;
        auVar15._8_4_ = fVar3;
        auVar15._12_4_ = fVar3;
        auVar51 = vfmadd231ps_fma(auVar51,auVar15,auVar40);
        auVar15 = vfmadd231ps_fma(auVar13,auVar17,*pauVar2);
        auVar13._8_4_ = 0x80000000;
        auVar13._0_8_ = 0x8000000080000000;
        auVar13._12_4_ = 0x80000000;
        auVar13 = vandps_avx(auVar51,auVar13);
        uVar29 = auVar13._0_4_;
        auVar61._0_4_ = (float)(uVar29 ^ auVar15._0_4_);
        uVar53 = auVar13._4_4_;
        auVar61._4_4_ = (float)(uVar53 ^ auVar15._4_4_);
        uVar54 = auVar13._8_4_;
        auVar61._8_4_ = (float)(uVar54 ^ auVar15._8_4_);
        uVar55 = auVar13._12_4_;
        auVar61._12_4_ = (float)(uVar55 ^ auVar15._12_4_);
        auVar13 = vfmadd231ps_fma(auVar14,auVar17,auVar59);
        auVar39._0_4_ = (float)(uVar29 ^ auVar13._0_4_);
        auVar39._4_4_ = (float)(uVar53 ^ auVar13._4_4_);
        auVar39._8_4_ = (float)(uVar54 ^ auVar13._8_4_);
        auVar39._12_4_ = (float)(uVar55 ^ auVar13._12_4_);
        auVar59 = ZEXT816(0) << 0x20;
        auVar13 = vcmpps_avx(auVar61,auVar59,5);
        auVar14 = vcmpps_avx(auVar39,auVar59,5);
        auVar13 = vandps_avx(auVar13,auVar14);
        auVar14 = vcmpps_avx(auVar51,auVar59,4);
        auVar13 = vandps_avx(auVar13,auVar14);
        auVar48._0_4_ = auVar61._0_4_ + auVar39._0_4_;
        auVar48._4_4_ = auVar61._4_4_ + auVar39._4_4_;
        auVar48._8_4_ = auVar61._8_4_ + auVar39._8_4_;
        auVar48._12_4_ = auVar61._12_4_ + auVar39._12_4_;
        auVar14 = vandps_avx(auVar51,auVar36);
        auVar51 = vcmpps_avx(auVar48,auVar14,2);
        auVar59 = auVar51 & auVar13;
        if ((((auVar59 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
             (auVar59 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar59 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            auVar59[0xf] < '\0') {
          auVar13 = vandps_avx(auVar13,auVar51);
          auVar49._0_4_ = auVar16._0_4_ * auVar37._0_4_;
          auVar49._4_4_ = auVar16._4_4_ * auVar37._4_4_;
          auVar49._8_4_ = auVar16._8_4_ * auVar37._8_4_;
          auVar49._12_4_ = auVar16._12_4_ * auVar37._12_4_;
          auVar51 = vfmadd132ps_fma(auVar11,auVar49,auVar60);
          auVar51 = vfmadd132ps_fma(auVar10,auVar51,auVar40);
          auVar50._0_4_ = uVar29 ^ auVar51._0_4_;
          auVar50._4_4_ = uVar53 ^ auVar51._4_4_;
          auVar50._8_4_ = uVar54 ^ auVar51._8_4_;
          auVar50._12_4_ = uVar55 ^ auVar51._12_4_;
          fVar9 = *(float *)(ray + k * 4 + 0x60);
          auVar52._0_4_ = fVar9 * auVar14._0_4_;
          auVar52._4_4_ = fVar9 * auVar14._4_4_;
          auVar52._8_4_ = fVar9 * auVar14._8_4_;
          auVar52._12_4_ = fVar9 * auVar14._12_4_;
          auVar51 = vcmpps_avx(auVar52,auVar50,1);
          fVar9 = *(float *)(ray + k * 4 + 0x100);
          auVar40._0_4_ = fVar9 * auVar14._0_4_;
          auVar40._4_4_ = fVar9 * auVar14._4_4_;
          auVar40._8_4_ = fVar9 * auVar14._8_4_;
          auVar40._12_4_ = fVar9 * auVar14._12_4_;
          auVar14 = vcmpps_avx(auVar50,auVar40,2);
          auVar14 = vandps_avx(auVar51,auVar14);
          auVar13 = vandps_avx(auVar13,auVar14);
          iVar21 = vmovmskps_avx(auVar13);
          if (iVar21 != 0) {
            local_8d8._0_1_ = (byte)iVar21;
            local_8d8 = (ulong)(byte)local_8d8;
            do {
              uVar30 = 0;
              for (uVar12 = local_8d8; (uVar12 & 1) == 0; uVar12 = uVar12 >> 1 | 0x8000000000000000)
              {
                uVar30 = uVar30 + 1;
              }
              if ((((context->scene->geometries).items
                    [*(uint *)(lVar24 + uVar28 + 0x90 + uVar30 * 4)].ptr)->mask &
                  *(uint *)(ray + k * 4 + 0x120)) != 0) {
                *(undefined4 *)(ray + k * 4 + 0x100) = 0xff800000;
                return bVar32;
              }
              local_8d8 = local_8d8 ^ 1L << (uVar30 & 0x3f);
            } while (local_8d8 != 0);
          }
        }
        lVar22 = lVar22 + 1;
      } while (lVar22 != uVar23 - 8);
    }
LAB_0055aa0f:
    bVar32 = puVar26 != &local_7d8;
    if (!bVar32) {
      return bVar32;
    }
  } while( true );
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }